

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O0

void __thiscall
miniros::Connection::writeHeader
          (Connection *this,M_string *key_vals,WriteFinishedFunc *finished_callback)

{
  uint uVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *__src;
  uint *puVar4;
  int in_ESI;
  Connection *in_RDI;
  anon_class_8_1_8991fb9c wrapFn;
  shared_ptr<unsigned_char[]> full_msg;
  uint32_t msg_len;
  uint32_t len;
  shared_ptr<unsigned_char[]> buffer;
  enable_shared_from_this<miniros::Connection> *in_stack_ffffffffffffff28;
  shared_ptr<unsigned_char[]> *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  function<void_(const_std::shared_ptr<miniros::Connection>_&)> *this_00;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  Connection *in_stack_ffffffffffffff50;
  undefined1 *__n;
  undefined1 local_88 [40];
  undefined1 local_60 [80];
  int local_10;
  
  local_10 = in_ESI;
  std::function<void_(const_std::shared_ptr<miniros::Connection>_&)>::operator=
            ((function<void_(const_std::shared_ptr<miniros::Connection>_&)> *)
             in_stack_ffffffffffffff50,
             (function<void_(const_std::shared_ptr<miniros::Connection>_&)> *)
             CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  peVar2 = std::__shared_ptr_access<miniros::Transport,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<miniros::Transport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x42d91e);
  uVar1 = (*peVar2->_vptr_Transport[0xb])();
  if ((uVar1 & 1) == 0) {
    std::enable_shared_from_this<miniros::Connection>::shared_from_this(in_stack_ffffffffffffff28);
    onHeaderWritten(in_stack_ffffffffffffff50,
                    (ConnectionPtr *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    std::shared_ptr<miniros::Connection>::~shared_ptr((shared_ptr<miniros::Connection> *)0x42d960);
  }
  else {
    std::shared_ptr<unsigned_char[]>::shared_ptr((shared_ptr<unsigned_char[]> *)0x42d99d);
    Header::write(local_10,local_60 + 0x18,(size_t)(local_60 + 0x14));
    local_60._16_4_ = local_60._20_4_ + 4;
    operator_new__((ulong)(uint)local_60._16_4_);
    std::shared_ptr<unsigned_char[]>::shared_ptr<unsigned_char,void>
              (in_stack_ffffffffffffff30,(uchar *)in_stack_ffffffffffffff28);
    this_00 = (function<void_(const_std::shared_ptr<miniros::Connection>_&)> *)local_60;
    peVar3 = std::__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2> *)this_00);
    peVar3 = peVar3 + 4;
    __src = std::__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>::get
                      ((__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2> *)
                       (local_60 + 0x18));
    memcpy(peVar3,__src,(ulong)(uint)local_60._20_4_);
    puVar4 = (uint *)std::__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>::get
                               ((__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2> *)this_00
                               );
    *puVar4 = local_60._20_4_;
    __n = local_88;
    uVar1 = local_60._16_4_;
    std::function<void(std::shared_ptr<miniros::Connection>const&)>::
    function<miniros::Connection::writeHeader(std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&,std::function<void(std::shared_ptr<miniros::Connection>const&)>const&)::__0&,void>
              (this_00,(anon_class_8_1_8991fb9c *)
                       CONCAT44(local_60._20_4_,in_stack_ffffffffffffff38));
    write(in_RDI,(int)this_00,(void *)(ulong)uVar1,(size_t)__n);
    std::function<void_(const_std::shared_ptr<miniros::Connection>_&)>::~function
              ((function<void_(const_std::shared_ptr<miniros::Connection>_&)> *)0x42da99);
    std::shared_ptr<unsigned_char[]>::~shared_ptr((shared_ptr<unsigned_char[]> *)0x42daa3);
    std::shared_ptr<unsigned_char[]>::~shared_ptr((shared_ptr<unsigned_char[]> *)0x42dab0);
  }
  return;
}

Assistant:

void Connection::writeHeader(const M_string& key_vals, const WriteFinishedFunc& finished_callback)
{
  MINIROS_ASSERT(!header_written_callback_);
  header_written_callback_ = finished_callback;

  if (!transport_->requiresHeader())
  {
    onHeaderWritten(shared_from_this());
    return;
  }

  std::shared_ptr<uint8_t[]> buffer;
  uint32_t len;
  Header::write(key_vals, buffer, len);

  uint32_t msg_len = len + 4;
  std::shared_ptr<uint8_t[]> full_msg(new uint8_t[msg_len]);
  memcpy(full_msg.get() + 4, buffer.get(), len);
  *((uint32_t*)full_msg.get()) = len;

  auto wrapFn = [this](const ConnectionPtr& conn)
  {
    this->onHeaderWritten(conn);
  };
  write(full_msg, msg_len, wrapFn, false);
}